

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zg.cc
# Opt level: O2

state_status_t
tchecker::zg::initial
          (system_t *system,vloc_sptr_t *vloc,intval_sptr_t *intval,zone_sptr_t *zone,
          vedge_sptr_t *vedge,sync_id_t *sync_id,clock_constraint_container_t *invariant,
          semantics_t *semantics,extrapolation_t *extrapolation,initial_value_t *initial_range)

{
  uint uVar1;
  bool bVar2;
  state_status_t sVar3;
  zone_t *this;
  db_t *pdVar4;
  make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL> *pmVar5;
  vloc_t *vloc_00;
  make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *pmVar6;
  
  sVar3 = ta::initial(system,vloc,intval,vedge,sync_id,invariant,initial_range);
  if (sVar3 == 1) {
    this = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
            ::operator->(zone)->super_zone_t;
    pdVar4 = zone_t::dbm(this);
    pmVar5 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
             ::operator->(zone);
    uVar1 = (pmVar5->super_zone_t)._dim;
    vloc_00 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
               ::operator*(vloc)->super_vloc_t;
    bVar2 = ta::delay_allowed(system,vloc_00);
    sVar3 = (*semantics->_vptr_semantics_t[2])(semantics,pdVar4,(ulong)uVar1,(ulong)bVar2,invariant)
    ;
    if (sVar3 == 1) {
      pmVar6 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
               ::operator*(vloc);
      (*extrapolation->_vptr_extrapolation_t[2])(extrapolation,pdVar4,(ulong)uVar1,pmVar6);
      sVar3 = 1;
    }
  }
  return sVar3;
}

Assistant:

tchecker::state_status_t initial(tchecker::ta::system_t const & system, tchecker::vloc_sptr_t const & vloc,
                                 tchecker::intval_sptr_t const & intval, tchecker::zg::zone_sptr_t const & zone,
                                 tchecker::vedge_sptr_t const & vedge, tchecker::sync_id_t & sync_id,
                                 tchecker::clock_constraint_container_t & invariant, tchecker::zg::semantics_t & semantics,
                                 tchecker::zg::extrapolation_t & extrapolation,
                                 tchecker::zg::initial_value_t const & initial_range)
{
  tchecker::state_status_t status = tchecker::ta::initial(system, vloc, intval, vedge, sync_id, invariant, initial_range);
  if (status != tchecker::STATE_OK)
    return status;

  tchecker::dbm::db_t * dbm = zone->dbm();
  tchecker::clock_id_t dim = zone->dim();
  bool delay_allowed = tchecker::ta::delay_allowed(system, *vloc);

  status = semantics.initial(dbm, dim, delay_allowed, invariant);
  if (status != tchecker::STATE_OK)
    return status;

  extrapolation.extrapolate(dbm, dim, *vloc);

  return tchecker::STATE_OK;
}